

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadString(CrateReader *this,string *s)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  byte unaff_BPL;
  char *pcVar5;
  Index string_index;
  optional<tinyusdz::Token> tok;
  ostringstream ss_e;
  Index local_1e4;
  optional<tinyusdz::Token> local_1e0;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  local_1e4.value = 0xffffffff;
  bVar1 = ReadIndex(this,&local_1e4);
  if (bVar1) {
    GetStringToken(&local_1e0,this,local_1e4);
    bVar1 = local_1e0.has_value_;
    if (local_1e0.has_value_ == true) {
      ::std::__cxx11::string::_M_assign((string *)s);
      uVar2 = this->_memoryUsage + s->_M_string_length;
      this->_memoryUsage = uVar2;
      unaff_BPL = 1;
      if ((this->_config).maxMemoryBudget < uVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_198);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadString",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_198,0xff);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Reached to max memory budget.",0x1d);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1b8);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_198);
        ::std::ios_base::~ios_base(local_128);
        unaff_BPL = 0;
      }
    }
    if ((local_1e0.has_value_ == true) &&
       (local_1e0.contained.data.__align !=
        (anon_struct_8_0_00000001_for___align)((long)&local_1e0.contained + 0x10))) {
      operator_delete((void *)local_1e0.contained.data._0_8_,local_1e0.contained._16_8_ + 1);
    }
    if (bVar1 != false) goto LAB_001a3af4;
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadString",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_198,0x104);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = "Invalid StringIndex.";
    lVar4 = 0x14;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadString",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_198,0xf9);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = "Failed to read Index for string data.";
    lVar4 = 0x25;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,lVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append
            ((char *)&this->_err,CONCAT71(local_1e0._1_7_,local_1e0.has_value_));
  if ((void *)CONCAT71(local_1e0._1_7_,local_1e0.has_value_) !=
      (void *)((long)&local_1e0.contained + 8)) {
    operator_delete((void *)CONCAT71(local_1e0._1_7_,local_1e0.has_value_),
                    local_1e0.contained._8_8_ + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_198);
  ::std::ios_base::~ios_base(local_128);
  unaff_BPL = 0;
LAB_001a3af4:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CrateReader::ReadString(std::string *s) {
  // string is serialized as StringIndex
  crate::Index string_index;
  if (!ReadIndex(&string_index)) {
    PUSH_ERROR("Failed to read Index for string data.");
    return false;
  }

  if (auto tok = GetStringToken(string_index)) {
    (*s) = tok.value().str();
    CHECK_MEMORY_USAGE(s->size());
    return true;
  }


  PUSH_ERROR("Invalid StringIndex.");
  return false;
}